

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int kinLsBandDQJac(N_Vector u,N_Vector fu,SUNMatrix Jac,KINMem kin_mem,N_Vector tmp1,N_Vector tmp2)

{
  double dVar1;
  long lVar2;
  int iVar3;
  sunindextype sVar4;
  sunindextype sVar5;
  sunindextype sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  sunrealtype *psVar13;
  long in_RCX;
  SUNMatrix in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  int retval;
  KINLsMem kinls_mem;
  sunrealtype *uscale_data;
  sunrealtype *utemp_data;
  sunrealtype *u_data;
  sunrealtype *futemp_data;
  sunrealtype *fu_data;
  sunrealtype *col_j;
  sunindextype mlower;
  sunindextype mupper;
  sunindextype N;
  sunindextype i2;
  sunindextype i1;
  sunindextype ngroups;
  sunindextype width;
  sunindextype j;
  sunindextype i;
  sunindextype group;
  N_Vector utemp;
  N_Vector futemp;
  sunrealtype inc_inv;
  sunrealtype inc;
  long local_120;
  long local_118;
  double local_110;
  double local_100;
  long local_f0;
  long local_70;
  long local_68;
  long local_60;
  
  lVar2 = *(long *)(in_RCX + 0x248);
  sVar4 = SUNBandMatrix_Columns(in_RDX);
  sVar5 = SUNBandMatrix_UpperBandwidth(in_RDX);
  sVar6 = SUNBandMatrix_LowerBandwidth(in_RDX);
  lVar7 = N_VGetArrayPointer(in_RSI);
  lVar8 = N_VGetArrayPointer(in_R8);
  lVar9 = N_VGetArrayPointer(in_RDI);
  lVar10 = N_VGetArrayPointer(*(undefined8 *)(in_RCX + 0x128));
  lVar11 = N_VGetArrayPointer(in_R9);
  N_VScale(0x3ff0000000000000,in_RDI,in_R9);
  lVar12 = sVar6 + sVar5 + 1;
  local_f0 = sVar4;
  if (lVar12 < sVar4) {
    local_f0 = lVar12;
  }
  local_60 = 1;
  while( true ) {
    if (local_f0 < local_60) {
      *(long *)(lVar2 + 0x40) = local_f0 + *(long *)(lVar2 + 0x40);
      return 0;
    }
    for (local_70 = local_60 + -1; local_70 < sVar4; local_70 = lVar12 + local_70) {
      if (ABS(*(double *)(lVar9 + local_70 * 8)) <= 1.0 / ABS(*(double *)(lVar10 + local_70 * 8))) {
        local_100 = 1.0 / ABS(*(double *)(lVar10 + local_70 * 8));
      }
      else {
        local_100 = ABS(*(double *)(lVar9 + local_70 * 8));
      }
      *(double *)(lVar11 + local_70 * 8) =
           *(double *)(in_RCX + 0x88) * local_100 + *(double *)(lVar11 + local_70 * 8);
    }
    iVar3 = (**(code **)(in_RCX + 0x10))(in_R9,in_R8,*(undefined8 *)(in_RCX + 0x18));
    if (iVar3 != 0) break;
    for (local_70 = local_60 + -1; local_70 < sVar4; local_70 = lVar12 + local_70) {
      *(undefined8 *)(lVar11 + local_70 * 8) = *(undefined8 *)(lVar9 + local_70 * 8);
      psVar13 = SUNBandMatrix_Column(in_RDX,local_70);
      dVar1 = *(double *)(in_RCX + 0x88);
      if (ABS(*(double *)(lVar9 + local_70 * 8)) <= 1.0 / ABS(*(double *)(lVar10 + local_70 * 8))) {
        local_110 = 1.0 / ABS(*(double *)(lVar10 + local_70 * 8));
      }
      else {
        local_110 = ABS(*(double *)(lVar9 + local_70 * 8));
      }
      if (local_70 - sVar5 < 0) {
        local_118 = 0;
      }
      else {
        local_118 = local_70 - sVar5;
      }
      if (local_70 + sVar6 < sVar4 + -1) {
        local_120 = local_70 + sVar6;
      }
      else {
        local_120 = sVar4 + -1;
      }
      for (local_68 = local_118; local_68 <= local_120; local_68 = local_68 + 1) {
        psVar13[local_68 - local_70] =
             (1.0 / (dVar1 * local_110)) *
             (*(double *)(lVar8 + local_68 * 8) - *(double *)(lVar7 + local_68 * 8));
      }
    }
    local_60 = local_60 + 1;
  }
  return iVar3;
}

Assistant:

int kinLsBandDQJac(N_Vector u, N_Vector fu, SUNMatrix Jac, KINMem kin_mem,
                   N_Vector tmp1, N_Vector tmp2)
{
  sunrealtype inc, inc_inv;
  N_Vector futemp, utemp;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  sunrealtype *col_j, *fu_data, *futemp_data, *u_data, *utemp_data, *uscale_data;
  KINLsMem kinls_mem;
  int retval = 0;

  /* access LsMem interface structure */
  kinls_mem = (KINLsMem)kin_mem->kin_lmem;

  /* access matrix dimensions */
  N      = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of u and fu */
  futemp = tmp1;
  utemp  = tmp2;

  /* Obtain pointers to the data for ewt, fy, futemp, y, ytemp */
  fu_data     = N_VGetArrayPointer(fu);
  futemp_data = N_VGetArrayPointer(futemp);
  u_data      = N_VGetArrayPointer(u);
  uscale_data = N_VGetArrayPointer(kin_mem->kin_uscale);
  utemp_data  = N_VGetArrayPointer(utemp);

  /* Load utemp with u */
  N_VScale(ONE, u, utemp);

  /* Set bandwidth and number of column groups for band differencing */
  width   = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  for (group = 1; group <= ngroups; group++)
  {
    /* Increment all utemp components in group */
    for (j = group - 1; j < N; j += width)
    {
      inc = kin_mem->kin_sqrt_relfunc *
            SUNMAX(SUNRabs(u_data[j]), ONE / SUNRabs(uscale_data[j]));
      utemp_data[j] += inc;
    }

    /* Evaluate f with incremented u */
    retval = kin_mem->kin_func(utemp, futemp, kin_mem->kin_user_data);
    if (retval != 0) { return (retval); }

    /* Restore utemp components, then form and load difference quotients */
    for (j = group - 1; j < N; j += width)
    {
      utemp_data[j] = u_data[j];
      col_j         = SUNBandMatrix_Column(Jac, j);
      inc           = kin_mem->kin_sqrt_relfunc *
            SUNMAX(SUNRabs(u_data[j]), ONE / SUNRabs(uscale_data[j]));
      inc_inv = ONE / inc;
      i1      = SUNMAX(0, j - mupper);
      i2      = SUNMIN(j + mlower, N - 1);
      for (i = i1; i <= i2; i++)
      {
        SM_COLUMN_ELEMENT_B(col_j, i, j) = inc_inv *
                                           (futemp_data[i] - fu_data[i]);
      }
    }
  }

  /* Increment counter nfeDQ */
  kinls_mem->nfeDQ += ngroups;

  return (0);
}